

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_WHILE(DisasContext_conflict1 *s,arg_WHILE *a)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TCGContext_conflict1 *tcg_ctx;
  undefined1 uVar4;
  undefined1 extraout_AL;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGTemp *pTVar5;
  TCGv_i64 v1;
  TCGv_i32 pTVar6;
  TCGTemp *ts;
  ulong a2;
  uintptr_t o_1;
  TCGv_i64 c2;
  uintptr_t o;
  TCGv_i32 ret_01;
  uintptr_t o_2;
  TCGv_i64 ret_02;
  bool bVar7;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = s->sve_len;
  uVar4 = sve_access_check_aarch64(s);
  if ((bool)uVar4) {
    ret = read_cpu_reg_aarch64(s,a->rn,1);
    ret_00 = read_cpu_reg_aarch64(s,a->rm,1);
    if (a->sf == 0) {
      if (a->u == 0) {
        tcg_gen_ext32s_i64_aarch64(tcg_ctx,ret,ret);
        tcg_gen_ext32s_i64_aarch64(tcg_ctx,ret_00,ret_00);
      }
      else {
        tcg_gen_ext32u_i64_aarch64(tcg_ctx,ret,ret);
        tcg_gen_ext32u_i64_aarch64(tcg_ctx,ret_00,ret_00);
      }
    }
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    ret_02 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    c2 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
    tcg_gen_sub_i64(tcg_ctx,ret_02,ret_00,ret);
    v1 = tcg_const_i64_aarch64(tcg_ctx,(ulong)(uVar1 >> ((byte)a->esz & 0x1f)));
    if (a->eq != 0) {
      tcg_gen_addi_i64_aarch64(tcg_ctx,ret_02,ret_02,1);
      bVar7 = a->u != 0;
      a2 = (ulong)((uint)bVar7 << 0x1f) | 0x7fffffff;
      if (a->sf != 0) {
        a2 = (ulong)bVar7 << 0x3f | 0x7fffffffffffffff;
      }
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)pTVar5,a2);
      tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_EQ,ret_02,ret_00,c2,v1,ret_02);
    }
    tcg_gen_umin_i64_aarch64(tcg_ctx,ret_02,ret_02,v1);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v1 + (long)tcg_ctx));
    iVar2 = a->u;
    iVar3 = a->eq;
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)pTVar5,0);
    tcg_gen_movcond_i64_aarch64
              (tcg_ctx,(uint)(iVar3 != 0) * 8 + (uint)(iVar2 != 0) * 2 + TCG_COND_LT,ret_02,ret,
               ret_00,ret_02,c2);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    ret_01 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,ret_01,ret_02);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
    tcg_gen_shli_i32_aarch64(tcg_ctx,ret_01,ret_01,a->esz);
    pTVar6 = tcg_const_i32_aarch64(tcg_ctx,(a->esz & 3U) << 10 | (uVar1 >> 3) - 2 & 0xfffff3ff);
    ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_aarch64
              (tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
               (long)(a->rd * 0x20 + 0x2c10));
    local_48 = ts;
    local_40 = pTVar5;
    local_38 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,helper_sve_while_aarch64,pTVar5,3,&local_48);
    do_pred_flags(tcg_ctx,ret_01);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts);
    tcg_temp_free_internal_aarch64(tcg_ctx,pTVar5);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    uVar4 = extraout_AL;
  }
  return (_Bool)uVar4;
}

Assistant:

static bool trans_WHILE(DisasContext *s, arg_WHILE *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 op0, op1, t0, t1, tmax;
    TCGv_i32 t2, t3;
    TCGv_ptr ptr;
    unsigned desc, vsz = vec_full_reg_size(s);
    TCGCond cond;

    if (!sve_access_check(s)) {
        return true;
    }

    op0 = read_cpu_reg(s, a->rn, 1);
    op1 = read_cpu_reg(s, a->rm, 1);

    if (!a->sf) {
        if (a->u) {
            tcg_gen_ext32u_i64(tcg_ctx, op0, op0);
            tcg_gen_ext32u_i64(tcg_ctx, op1, op1);
        } else {
            tcg_gen_ext32s_i64(tcg_ctx, op0, op0);
            tcg_gen_ext32s_i64(tcg_ctx, op1, op1);
        }
    }

    /* For the helper, compress the different conditions into a computation
     * of how many iterations for which the condition is true.
     */
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_sub_i64(tcg_ctx, t0, op1, op0);

    tmax = tcg_const_i64(tcg_ctx, vsz >> a->esz);
    if (a->eq) {
        /* Equality means one more iteration.  */
        tcg_gen_addi_i64(tcg_ctx, t0, t0, 1);

        /* If op1 is max (un)signed integer (and the only time the addition
         * above could overflow), then we produce an all-true predicate by
         * setting the count to the vector length.  This is because the
         * pseudocode is described as an increment + compare loop, and the
         * max integer would always compare true.
         */
        tcg_gen_movi_i64(tcg_ctx, t1, (a->sf
                              ? (a->u ? UINT64_MAX : INT64_MAX)
                              : (a->u ? UINT32_MAX : INT32_MAX)));
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, op1, t1, tmax, t0);
    }

    /* Bound to the maximum.  */
    tcg_gen_umin_i64(tcg_ctx, t0, t0, tmax);
    tcg_temp_free_i64(tcg_ctx, tmax);

    /* Set the count to zero if the condition is false.  */
    cond = (a->u
            ? (a->eq ? TCG_COND_LEU : TCG_COND_LTU)
            : (a->eq ? TCG_COND_LE : TCG_COND_LT));
    tcg_gen_movi_i64(tcg_ctx, t1, 0);
    tcg_gen_movcond_i64(tcg_ctx, cond, t0, op0, op1, t0, t1);
    tcg_temp_free_i64(tcg_ctx, t1);

    /* Since we're bounded, pass as a 32-bit type.  */
    t2 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, t2, t0);
    tcg_temp_free_i64(tcg_ctx, t0);

    /* Scale elements to bits.  */
    tcg_gen_shli_i32(tcg_ctx, t2, t2, a->esz);

    desc = (vsz / 8) - 2;
    desc = deposit32(desc, SIMD_DATA_SHIFT, 2, a->esz);
    t3 = tcg_const_i32(tcg_ctx, desc);

    ptr = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, ptr, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));

    gen_helper_sve_while(tcg_ctx, t2, ptr, t2, t3);
    do_pred_flags(tcg_ctx, t2);

    tcg_temp_free_ptr(tcg_ctx, ptr);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    return true;
}